

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_waveform_generation.cc
# Opt level: O3

bool __thiscall
sptk::PeriodicWaveformGeneration::Get
          (PeriodicWaveformGeneration *this,double *sin,double *cos,double *sawtooth,double *pitch)

{
  double dVar1;
  InputSourceInterpolationWithMagicNumber *pIVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> tmp;
  
  if (((this->is_valid_ != true) ||
      (iVar5 = (*(this->input_source_->super_InputSourceInterface)._vptr_InputSourceInterface[4])(),
      dVar3 = dRam0000000000000000, (char)iVar5 == '\0')) ||
     (operator_delete((void *)0x0), dVar3 < 0.0)) {
    bVar4 = false;
  }
  else {
    pIVar2 = this->input_source_;
    dVar1 = pIVar2->magic_number_;
    dVar7 = dVar3;
    if (this->strict_ == false) {
      if (((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) && (this->extending_ == true)) {
        dVar7 = this->voiced_pitch_;
      }
    }
    dVar6 = dVar1;
    if (pitch != (double *)0x0) {
      *pitch = dVar7;
      dVar6 = pIVar2->magic_number_;
    }
    if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
      if (sin != (double *)0x0) {
        dVar6 = ::sin(this->phase_);
        *sin = dVar6;
      }
      if (cos != (double *)0x0) {
        dVar6 = ::cos(this->phase_);
        *cos = dVar6;
      }
      if (sawtooth != (double *)0x0) {
        *sawtooth = this->phase_ / 3.141592653589793 + -1.0;
      }
      if (this->strict_ == true) {
        dVar7 = 6.283185307179586 / dVar7 + this->phase_;
        this->phase_ = dVar7;
      }
      else {
        this->extending_ = true;
        this->voiced_pitch_ = dVar7;
        dVar6 = this->phase_;
        dVar7 = 6.283185307179586 / dVar7 + dVar6;
        this->phase_ = dVar7;
        if (((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) &&
           (((dVar6 <= 3.141592653589793 && (3.141592653589793 <= dVar7)) ||
            ((dVar6 <= 6.283185307179586 && (6.283185307179586 <= dVar7)))))) {
          this->extending_ = false;
        }
      }
      bVar4 = true;
      if (6.283185307179586 < dVar7) {
        this->phase_ = dVar7 + -6.283185307179586;
      }
    }
    else {
      this->phase_ = 0.0;
      if (sin != (double *)0x0) {
        *sin = this->unvoiced_value_;
      }
      if (cos != (double *)0x0) {
        *cos = this->unvoiced_value_;
      }
      bVar4 = true;
      if (sawtooth != (double *)0x0) {
        *sawtooth = this->unvoiced_value_;
      }
    }
  }
  return bVar4;
}

Assistant:

bool PeriodicWaveformGeneration::Get(double* sin, double* cos, double* sawtooth,
                                     double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  const bool unvoiced(input_source_->GetMagicNumber() ==
                      pitch_in_current_point);
  if (!strict_ && unvoiced && extending_) {
    pitch_in_current_point = voiced_pitch_;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }

  // If unvoiced point, return zero.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 0.0;
    if (sin) {
      *sin = unvoiced_value_;
    }
    if (cos) {
      *cos = unvoiced_value_;
    }
    if (sawtooth) {
      *sawtooth = unvoiced_value_;
    }
    return true;
  }

  if (sin) {
    *sin = std::sin(phase_);
  }
  if (cos) {
    *cos = std::cos(phase_);
  }
  if (sawtooth) {
    *sawtooth = phase_ / sptk::kPi - 1.0;
  }

  if (!strict_) {
    extending_ = true;
    voiced_pitch_ = pitch_in_current_point;
  }

  // Proceed phase.
  const double prev_phase(phase_);
  phase_ += sptk::kTwoPi / pitch_in_current_point;
  if (!strict_ && unvoiced &&
      ((prev_phase <= sptk::kPi && sptk::kPi <= phase_) ||
       (prev_phase <= sptk::kTwoPi && sptk::kTwoPi <= phase_))) {
    extending_ = false;
  }
  if (sptk::kTwoPi < phase_) {
    phase_ -= sptk::kTwoPi;
  }

  return true;
}